

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O3

mat4_t * mat4_ortho(mat4_t *__return_storage_ptr__,float left,float right,float bottom,float top)

{
  float in_XMM0_Db;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float in_XMM1_Db;
  float in_XMM2_Db;
  float in_XMM3_Db;
  
  auVar1._0_8_ = CONCAT44(bottom + top,left + right) ^ 0x8000000080000000;
  auVar1._8_4_ = -(in_XMM0_Db + in_XMM1_Db);
  auVar1._12_4_ = -(in_XMM2_Db + in_XMM3_Db);
  auVar2._4_4_ = top - bottom;
  auVar2._0_4_ = right - left;
  auVar2._8_4_ = in_XMM1_Db - in_XMM0_Db;
  auVar2._12_4_ = in_XMM3_Db - in_XMM2_Db;
  auVar2 = divps(auVar1,auVar2);
  __return_storage_ptr__->m[0][0] = 2.0 / (right - left);
  *(float *)((long)__return_storage_ptr__ + 4) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->m[0] + 3) = 0;
  __return_storage_ptr__->m[1][1] = 2.0 / (top - bottom);
  ((float *)((long)__return_storage_ptr__ + 0x10))[2] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x10))[3] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[0] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[1] = 0.0;
  __return_storage_ptr__->m[2][2] = -1.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = auVar2._0_4_;
  __return_storage_ptr__->m[3][1] = auVar2._4_4_;
  ((float *)((long)__return_storage_ptr__ + 0x30))[2] = -0.0;
  ((float *)((long)__return_storage_ptr__ + 0x30))[3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4_t
mat4_ortho(float left, float right, float bottom, float top) {
    return mat4_ortho4(left, right, bottom, top, -1.0f, 1.0f);
}